

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfcn.cpp
# Opt level: O0

void nms_sorted_bboxes(vector<Object,_std::allocator<Object>_> *objects,
                      vector<int,_std::allocator<int>_> *picked,float nms_threshold)

{
  bool bVar1;
  size_type sVar2;
  vector<float,_std::allocator<float>_> *this;
  const_reference this_00;
  reference pvVar3;
  reference pvVar4;
  vector<int,_std::allocator<int>_> *in_RSI;
  Object *in_RDI;
  float in_XMM0_Da;
  float fVar5;
  float fVar6;
  float union_area;
  float inter_area;
  Object *b;
  int j;
  int keep;
  Object *a;
  int i_1;
  int i;
  vector<float,_std::allocator<float>_> areas;
  int n;
  Object *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  int iVar7;
  undefined4 in_stack_ffffffffffffff7c;
  int local_60;
  int local_4c;
  int local_48;
  vector<float,_std::allocator<float>_> local_30;
  int local_18;
  float local_14;
  vector<int,_std::allocator<int>_> *local_10;
  Object *local_8;
  
  local_14 = in_XMM0_Da;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1440cd);
  sVar2 = std::vector<Object,_std::allocator<Object>_>::size
                    ((vector<Object,_std::allocator<Object>_> *)local_8);
  local_18 = (int)sVar2;
  this = (vector<float,_std::allocator<float>_> *)(long)local_18;
  std::allocator<float>::allocator((allocator<float> *)0x1440fd);
  std::vector<float,_std::allocator<float>_>::vector
            (this,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  std::allocator<float>::~allocator((allocator<float> *)0x14411d);
  for (local_48 = 0; local_48 < local_18; local_48 = local_48 + 1) {
    this_00 = std::vector<Object,_std::allocator<Object>_>::operator[]
                        ((vector<Object,_std::allocator<Object>_> *)local_8,(long)local_48);
    fVar5 = cv::Rect_<float>::area(&this_00->rect);
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_30,(long)local_48);
    *pvVar3 = fVar5;
  }
  for (local_4c = 0; local_4c < local_18; local_4c = local_4c + 1) {
    std::vector<Object,_std::allocator<Object>_>::operator[]
              ((vector<Object,_std::allocator<Object>_> *)local_8,(long)local_4c);
    bVar1 = true;
    local_60 = 0;
    while( true ) {
      iVar7 = local_60;
      sVar2 = std::vector<int,_std::allocator<int>_>::size(local_10);
      if ((int)sVar2 <= iVar7) break;
      in_stack_ffffffffffffff68 = local_8;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_10,(long)local_60);
      std::vector<Object,_std::allocator<Object>_>::operator[]
                ((vector<Object,_std::allocator<Object>_> *)in_stack_ffffffffffffff68,(long)*pvVar4)
      ;
      fVar6 = intersection_area((Object *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                in_stack_ffffffffffffff68);
      in_stack_ffffffffffffff74 = fVar6;
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_30,(long)local_4c);
      fVar5 = *pvVar3;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_10,(long)local_60);
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_30,(long)*pvVar4);
      if (local_14 < fVar6 / ((fVar5 + *pvVar3) - fVar6)) {
        bVar1 = false;
      }
      local_60 = local_60 + 1;
    }
    if (bVar1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (value_type_conflict *)in_stack_ffffffffffffff68);
    }
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  return;
}

Assistant:

static void nms_sorted_bboxes(const std::vector<Object>& objects, std::vector<int>& picked, float nms_threshold)
{
    picked.clear();

    const int n = objects.size();

    std::vector<float> areas(n);
    for (int i = 0; i < n; i++)
    {
        areas[i] = objects[i].rect.area();
    }

    for (int i = 0; i < n; i++)
    {
        const Object& a = objects[i];

        int keep = 1;
        for (int j = 0; j < (int)picked.size(); j++)
        {
            const Object& b = objects[picked[j]];

            // intersection over union
            float inter_area = intersection_area(a, b);
            float union_area = areas[i] + areas[picked[j]] - inter_area;
            //             float IoU = inter_area / union_area
            if (inter_area / union_area > nms_threshold)
                keep = 0;
        }

        if (keep)
            picked.push_back(i);
    }
}